

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_lu.c
# Opt level: O0

_Bool test_lu_invmul_x(_Bool inplace,int n_row,int n_col,int N,int field)

{
  long lVar1;
  FILE *__stream;
  int iVar2;
  int *orig;
  int *piVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int aiStackY_170 [2];
  undefined4 uStackY_168;
  int iStackY_164;
  int in_stack_fffffffffffffea0;
  int iStack_154;
  int local_150 [2];
  int local_148 [2];
  int local_140 [6];
  int local_128 [2];
  int local_120 [2];
  uint8_t local_118 [4];
  int iStack_114;
  int local_110 [4];
  uint8_t local_100 [8];
  unsigned_long __vla_expr7;
  int local_ec;
  undefined1 local_e8 [4];
  int i_1;
  m256v X1;
  unsigned_long __vla_expr6;
  unsigned_long __vla_expr5;
  int rank;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  m256v Y;
  unsigned_long __vla_expr2;
  m256v X;
  unsigned_long __vla_expr1;
  m256v A;
  unsigned_long __vla_expr0;
  uint local_30;
  int i;
  int ntest;
  uint8_t mask;
  int data_width;
  int maxdim;
  int field_local;
  int N_local;
  int n_col_local;
  int n_row_local;
  _Bool inplace_local;
  
  local_110[2] = n_col;
  if (n_col < n_row) {
    local_110[2] = n_row;
  }
  get_mask(in_stack_fffffffffffffea0);
  local_30 = 0;
  while( true ) {
    if (N <= (int)local_30) {
      return true;
    }
    lVar1 = -((ulong)((uint8_t *)(ulong)(uint)(n_row * n_col) + 0xf) & 0xfffffffffffffff0);
    puVar5 = (uint8_t *)((long)&uStackY_168 + lVar1);
    A.e = (uint8_t *)(ulong)(uint)(n_row * n_col);
    *(undefined8 *)((long)aiStackY_170 + lVar1) = 0x1024bb;
    rand_coeffs(*(uint8_t **)((long)local_140 + lVar1 + -0x20),*(int *)((long)&iStackY_164 + lVar1),
                *(uint8_t *)((long)&uStackY_168 + lVar1 + 3));
    *(undefined8 *)((long)aiStackY_170 + lVar1) = 0x1024d8;
    m256v_make((m256v *)&__vla_expr1,n_row,n_col,puVar5);
    lVar1 = -((ulong)((uint8_t *)(ulong)(uint)(n_col << 2) + 0xf) & 0xfffffffffffffff0);
    puVar4 = puVar5 + lVar1;
    X.e = (uint8_t *)(ulong)(uint)(n_col << 2);
    builtin_memcpy(puVar5 + lVar1 + -8,"\b%\x10",4);
    puVar4[-4] = '\0';
    puVar4[-3] = '\0';
    puVar4[-2] = '\0';
    puVar4[-1] = '\0';
    rand_coeffs(*(uint8_t **)(puVar4 + 8),*(int *)(puVar4 + 4),puVar4[3]);
    builtin_memcpy(puVar5 + lVar1 + -8,"-%\x10",4);
    puVar4[-4] = '\0';
    puVar4[-3] = '\0';
    puVar4[-2] = '\0';
    puVar4[-1] = '\0';
    m256v_make((m256v *)&__vla_expr2,n_col,4,puVar4);
    Y.e = (uint8_t *)(ulong)(uint)(local_110[2] << 2);
    puVar4 = puVar4 + -((ulong)(Y.e + 0xf) & 0xfffffffffffffff0);
    builtin_memcpy(puVar5 + -((ulong)(Y.e + 0xf) & 0xfffffffffffffff0) + lVar1 + -8,"g%\x10",4);
    puVar4[-4] = '\0';
    puVar4[-3] = '\0';
    puVar4[-2] = '\0';
    puVar4[-1] = '\0';
    m256v_make((m256v *)&__vla_expr3,local_110[2],4,puVar4);
    __vla_expr3._0_4_ = n_row;
    puVar4[-8] = 0x8a;
    puVar4[-7] = '%';
    puVar4[-6] = '\x10';
    puVar4[-5] = '\0';
    puVar4[-4] = '\0';
    puVar4[-3] = '\0';
    puVar4[-2] = '\0';
    puVar4[-1] = '\0';
    m256v_mul(*(m256v **)(puVar4 + 0x28),*(m256v **)(puVar4 + 0x20),*(m256v **)(puVar4 + 0x18));
    orig = (int *)((long)(puVar4 + -((ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0)) -
                  ((ulong)(uint)n_col * 4 + 0xf & 0xfffffffffffffff0));
    orig[-2] = 0x1025df;
    orig[-1] = 0;
    iVar2 = m256v_LU_decomp_inplace(*(m256v **)(orig + 10),*(int **)(orig + 8),*(int **)(orig + 6));
    if (inplace) {
      piVar3 = (int *)((long)orig - ((ulong)(uint)n_col * 4 + 0xf & 0xfffffffffffffff0));
      piVar3[-2] = 0x102637;
      piVar3[-1] = 0;
      perm_invert(n_col,orig,piVar3);
      __vla_expr3._0_4_ = local_110[2];
      piVar3[-2] = 0x102664;
      piVar3[-1] = 0;
      m256v_LU_invmult_inplace
                (*(m256v **)(piVar3 + 0x16),piVar3[0x15],*(int **)(piVar3 + 0x12),
                 *(int **)(piVar3 + 0x10),*(m256v **)(piVar3 + 0xe));
      __vla_expr3._0_4_ = n_col;
    }
    else {
      puVar5 = (uint8_t *)
               ((long)orig -
               ((ulong)((uint8_t *)(ulong)(uint)(n_col << 2) + 0xf) & 0xfffffffffffffff0));
      X1.e = (uint8_t *)(ulong)(uint)(n_col << 2);
      puVar5[-8] = 0xbd;
      puVar5[-7] = '&';
      puVar5[-6] = '\x10';
      puVar5[-5] = '\0';
      puVar5[-4] = '\0';
      puVar5[-3] = '\0';
      puVar5[-2] = '\0';
      puVar5[-1] = '\0';
      rand_coeffs(*(uint8_t **)(puVar5 + 8),*(int *)(puVar5 + 4),puVar5[3]);
      puVar5[-8] = 0xd8;
      puVar5[-7] = '&';
      puVar5[-6] = '\x10';
      puVar5[-5] = '\0';
      puVar5[-4] = '\0';
      puVar5[-3] = '\0';
      puVar5[-2] = '\0';
      puVar5[-1] = '\0';
      m256v_make((m256v *)local_e8,n_col,4,puVar5);
      builtin_memcpy(puVar5 + -8,"\x03\'\x10",4);
      puVar5[-4] = '\0';
      puVar5[-3] = '\0';
      puVar5[-2] = '\0';
      puVar5[-1] = '\0';
      m256v_LU_invmult(*(m256v **)(puVar5 + 0x68),*(int *)(puVar5 + 100),*(int **)(puVar5 + 0x58),
                       *(int **)(puVar5 + 0x50),*(m256v **)(puVar5 + 0x48),
                       *(m256v **)(puVar5 + 0x40));
      __vla_expr3._0_4_ = n_col;
      for (local_ec = 0; local_ec < n_col; local_ec = local_ec + 1) {
        builtin_memcpy(puVar5 + -8,"@\'\x10",4);
        puVar5[-4] = '\0';
        puVar5[-3] = '\0';
        puVar5[-2] = '\0';
        puVar5[-1] = '\0';
        m256v_copy_row(*(m256v **)(puVar5 + 0x28),*(int *)(puVar5 + 0x24),*(m256v **)(puVar5 + 0x18)
                       ,*(int *)(puVar5 + 0x14));
      }
    }
    orig[-2] = 0x10276b;
    orig[-1] = 0;
    m256v_add_inplace(*(m256v **)(orig + 2),*(m256v **)orig);
    if (iVar2 < n_col) {
      piVar3 = (int *)((long)orig - ((ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0));
      piVar3[-2] = 0x1027b5;
      piVar3[-1] = 0;
      perm_invert(n_row,(int *)(puVar4 + -((ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0)),
                  piVar3);
      __vla_expr3._0_4_ = local_110[2];
      piVar3[-2] = 0x1027dc;
      piVar3[-1] = 0;
      m256v_LU_mult_inplace
                (*(m256v **)(piVar3 + 0x12),*(int **)(piVar3 + 0x10),*(int **)(piVar3 + 0xe),
                 *(m256v **)(piVar3 + 0xc));
      __vla_expr3._0_4_ = n_row;
    }
    orig[-2] = 0x1027fb;
    orig[-1] = 0;
    iVar2 = m256v_iszero(*(m256v **)orig);
    __stream = _stderr;
    if (iVar2 == 0) break;
    local_30 = local_30 + 1;
  }
  orig[-2] = 0x10281e;
  orig[-1] = 0;
  fprintf(__stream,"Error:  LU inversion gave wrong result. (field=%d, it=%d)\n",(ulong)(uint)field,
          (ulong)local_30);
  return false;
}

Assistant:

static bool test_lu_invmul_x(bool inplace, int n_row, int n_col, int N, int field)
{
	const int maxdim = (n_row > n_col ? n_row : n_col);
	const int data_width = 4;
	const uint8_t mask = get_mask(field);

	int ntest = 0;
	for (int i = 0; i < N; ++i) {
		/* Create a random matrix & testing data */
		Def_mat256_rand(A, a, n_row, n_col, mask)
		Def_mat256_rand(X, x, n_col, data_width, mask)

		/* Compute Y := A*X the direct way */
		m256v_Def(Y, y, maxdim, data_width)
		Y.n_row = n_row;
		m256v_mul(&A, &X, &Y);

		/* Calculate LU decomposition */
		int rp[n_row], cp[n_col];
		const int rank = m256v_LU_decomp_inplace(&A, rp, cp);
		++ntest;

		/* Reconstruct X from LU and Y.
		 *
		 * This is not completely possible if the rank of the
		 * matrix is not full.  In such cases, we check if the
		 * difference of X with its reconstructed version is in
		 * the kernel of A.
		 */
		if (inplace) {
			int inv_cp[n_col];
			perm_invert(n_col, cp, inv_cp);

			Y.n_row = maxdim;
			m256v_LU_invmult_inplace(&A, rank, rp, inv_cp, &Y);
			Y.n_row = n_col;
		} else {
			Def_mat256_rand(X1, x1, n_col, data_width, mask)
			m256v_LU_invmult(&A, rank, rp, cp, &Y, &X1);

			/* Copy result back into Y */
			Y.n_row = n_col;
			for (int i = 0; i < n_col; ++i)
				m256v_copy_row(&X1, i, &Y, i);
		}

		/* Check the result */
		m256v_add_inplace(&X, &Y);
		if (rank < n_col) {
			/* If the matrix is not full rank, the resulting
			 * difference is not necessarily zero, but it
			 * must be in the kernel of A.
			 */
			int inv_rp[n_row];
			perm_invert(n_row, rp, inv_rp);
			Y.n_row = maxdim;
			m256v_LU_mult_inplace(&A, inv_rp, cp, &Y);
			Y.n_row = n_row;
		}
		if (!m256v_iszero(&Y)) {
			fprintf(stderr, "Error:  LU inversion gave "
			  "wrong result. (field=%d, it=%d)\n", field, i);
			return false;
		}
	}

	return true;
}